

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
QUtil::read_lines_from_file_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,QUtil *this,char *filename,bool preserve_eol)

{
  function<bool_(char_&)> local_68;
  anon_class_8_1_54a39806 local_48;
  anon_class_8_1_54a39806 next_char;
  FileCloser fc;
  FILE *local_28;
  FILE *f;
  QUtil *pQStack_18;
  bool preserve_eol_local;
  char *filename_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  
  f._7_1_ = (byte)filename & 1;
  f._6_1_ = 0;
  pQStack_18 = this;
  filename_local = (char *)__return_storage_ptr__;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(__return_storage_ptr__);
  local_28 = safe_fopen((char *)pQStack_18,"rb");
  FileCloser::FileCloser((FileCloser *)&next_char,local_28);
  local_48.f = &local_28;
  std::function<bool(char&)>::
  function<QUtil::read_lines_from_file[abi:cxx11](char_const*,bool)::__0&,void>
            ((function<bool(char&)> *)&local_68,&local_48);
  read_lines_from_file(&local_68,__return_storage_ptr__,(bool)(f._7_1_ & 1));
  std::function<bool_(char_&)>::~function(&local_68);
  f._6_1_ = 1;
  FileCloser::~FileCloser((FileCloser *)&next_char);
  if ((f._6_1_ & 1) == 0) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string>
QUtil::read_lines_from_file(char const* filename, bool preserve_eol)
{
    std::list<std::string> lines;
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    auto next_char = [&f](char& ch) { return read_char_from_FILE(ch, f); };
    read_lines_from_file(next_char, lines, preserve_eol);
    return lines;
}